

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void extents_traverse_func
               (void *closure,plutovg_path_command_t command,plutovg_point_t *points,int npoints)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (*(char *)((long)closure + 8) == '\0') {
    if (0 < npoints) {
      uVar1 = 0;
      do {
        fVar2 = points[uVar1].x;
        fVar3 = *(float *)((long)closure + 0x10);
        if (fVar2 <= *(float *)((long)closure + 0x10)) {
          fVar3 = fVar2;
        }
        *(float *)((long)closure + 0x10) = fVar3;
        fVar3 = points[uVar1].y;
        fVar4 = *(float *)((long)closure + 0x14);
        if (fVar3 <= *(float *)((long)closure + 0x14)) {
          fVar4 = fVar3;
        }
        *(float *)((long)closure + 0x14) = fVar4;
        fVar4 = *(float *)((long)closure + 0x18);
        if (*(float *)((long)closure + 0x18) <= fVar2) {
          fVar4 = fVar2;
        }
        *(float *)((long)closure + 0x18) = fVar4;
        fVar4 = *(float *)((long)closure + 0x1c);
        if (*(float *)((long)closure + 0x1c) <= fVar3) {
          fVar4 = fVar3;
        }
        *(float *)((long)closure + 0x1c) = fVar4;
        if (command != PLUTOVG_PATH_COMMAND_MOVE_TO) {
          fVar2 = hypotf(fVar2 - *closure,fVar3 - *(float *)((long)closure + 4));
          *(float *)((long)closure + 0xc) = fVar2 + *(float *)((long)closure + 0xc);
        }
        *(plutovg_point_t *)closure = points[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)npoints != uVar1);
    }
  }
  else {
    if (command != PLUTOVG_PATH_COMMAND_MOVE_TO) {
      __assert_fail("command == PLUTOVG_PATH_COMMAND_MOVE_TO",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-path.c"
                    ,0x2a8,
                    "void extents_traverse_func(void *, plutovg_path_command_t, const plutovg_point_t *, int)"
                   );
    }
    *(undefined1 *)((long)closure + 8) = 0;
    *(plutovg_point_t *)closure = *points;
    fVar2 = points->x;
    *(float *)((long)closure + 0x10) = fVar2;
    fVar3 = points->y;
    *(float *)((long)closure + 0x14) = fVar3;
    *(float *)((long)closure + 0x18) = fVar2;
    *(float *)((long)closure + 0x1c) = fVar3;
    *(undefined4 *)((long)closure + 0xc) = 0;
  }
  return;
}

Assistant:

static void extents_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    extents_calculator_t* calculator = (extents_calculator_t*)(closure);
    if(calculator->is_first_point) {
        assert(command == PLUTOVG_PATH_COMMAND_MOVE_TO);
        calculator->is_first_point = false;
        calculator->current_point = points[0];
        calculator->x1 = points[0].x;
        calculator->y1 = points[0].y;
        calculator->x2 = points[0].x;
        calculator->y2 = points[0].y;
        calculator->length = 0;
        return;
    }

    for(int i = 0; i < npoints; ++i) {
        calculator->x1 = plutovg_min(calculator->x1, points[i].x);
        calculator->y1 = plutovg_min(calculator->y1, points[i].y);
        calculator->x2 = plutovg_max(calculator->x2, points[i].x);
        calculator->y2 = plutovg_max(calculator->y2, points[i].y);
        if(command != PLUTOVG_PATH_COMMAND_MOVE_TO)
            calculator->length += hypotf(points[i].x - calculator->current_point.x, points[i].y - calculator->current_point.y);
        calculator->current_point = points[i];
    }
}